

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall google::protobuf::Descriptor::CopyTo(Descriptor *this,DescriptorProto *proto)

{
  int32 iVar1;
  uint uVar2;
  long lVar3;
  FieldDescriptorProto *pFVar4;
  OneofDescriptorProto *proto_00;
  DescriptorProto *proto_01;
  EnumDescriptorProto *proto_02;
  DescriptorProto_ExtensionRange *proto_03;
  DescriptorProto_ReservedRange *pDVar5;
  MessageOptions *pMVar6;
  MessageOptions *pMVar7;
  int i;
  long lVar8;
  int i_6;
  long lVar9;
  int i_7;
  
  DescriptorProto::_internal_set_name(proto,*(string **)this);
  lVar9 = 0;
  for (lVar8 = 0; lVar8 < *(int *)(this + 0x68); lVar8 = lVar8 + 1) {
    lVar3 = *(long *)(this + 0x28);
    pFVar4 = RepeatedPtrField<google::protobuf::FieldDescriptorProto>::Add(&proto->field_);
    FieldDescriptor::CopyTo((FieldDescriptor *)(lVar3 + lVar9),pFVar4);
    lVar9 = lVar9 + 0x98;
  }
  lVar9 = 0;
  for (lVar8 = 0; lVar8 < *(int *)(this + 0x6c); lVar8 = lVar8 + 1) {
    lVar3 = *(long *)(this + 0x30);
    proto_00 = RepeatedPtrField<google::protobuf::OneofDescriptorProto>::Add(&proto->oneof_decl_);
    OneofDescriptor::CopyTo((OneofDescriptor *)(lVar3 + lVar9),proto_00);
    lVar9 = lVar9 + 0x30;
  }
  lVar9 = 0;
  for (lVar8 = 0; lVar8 < *(int *)(this + 0x70); lVar8 = lVar8 + 1) {
    lVar3 = *(long *)(this + 0x38);
    proto_01 = RepeatedPtrField<google::protobuf::DescriptorProto>::Add(&proto->nested_type_);
    CopyTo((Descriptor *)(lVar3 + lVar9),proto_01);
    lVar9 = lVar9 + 0x90;
  }
  lVar9 = 0;
  for (lVar8 = 0; lVar8 < *(int *)(this + 0x74); lVar8 = lVar8 + 1) {
    lVar3 = *(long *)(this + 0x40);
    proto_02 = RepeatedPtrField<google::protobuf::EnumDescriptorProto>::Add(&proto->enum_type_);
    EnumDescriptor::CopyTo((EnumDescriptor *)(lVar3 + lVar9),proto_02);
    lVar9 = lVar9 + 0x50;
  }
  lVar9 = 0;
  for (lVar8 = 0; lVar8 < *(int *)(this + 0x78); lVar8 = lVar8 + 1) {
    lVar3 = *(long *)(this + 0x48);
    proto_03 = RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::Add
                         (&proto->extension_range_);
    ExtensionRange::CopyTo((ExtensionRange *)(lVar3 + lVar9),proto_03);
    lVar9 = lVar9 + 0x10;
  }
  lVar9 = 0;
  for (lVar8 = 0; lVar8 < *(int *)(this + 0x7c); lVar8 = lVar8 + 1) {
    lVar3 = *(long *)(this + 0x50);
    pFVar4 = RepeatedPtrField<google::protobuf::FieldDescriptorProto>::Add(&proto->extension_);
    FieldDescriptor::CopyTo((FieldDescriptor *)(lVar3 + lVar9),pFVar4);
    lVar9 = lVar9 + 0x98;
  }
  for (lVar8 = 0; lVar8 < *(int *)(this + 0x80); lVar8 = lVar8 + 1) {
    pDVar5 = RepeatedPtrField<google::protobuf::DescriptorProto_ReservedRange>::Add
                       (&proto->reserved_range_);
    lVar9 = *(long *)(this + 0x58);
    iVar1 = *(int32 *)(lVar9 + lVar8 * 8);
    uVar2 = (pDVar5->_has_bits_).has_bits_[0];
    (pDVar5->_has_bits_).has_bits_[0] = uVar2 | 1;
    pDVar5->start_ = iVar1;
    iVar1 = *(int32 *)(lVar9 + 4 + lVar8 * 8);
    (pDVar5->_has_bits_).has_bits_[0] = uVar2 | 3;
    pDVar5->end_ = iVar1;
  }
  for (lVar8 = 0; lVar8 < *(int *)(this + 0x84); lVar8 = lVar8 + 1) {
    DescriptorProto::add_reserved_name(proto,*(string **)(*(long *)(this + 0x60) + lVar8 * 8));
  }
  pMVar7 = *(MessageOptions **)(this + 0x20);
  pMVar6 = MessageOptions::default_instance();
  if (pMVar7 != pMVar6) {
    pMVar7 = DescriptorProto::_internal_mutable_options(proto);
    MessageOptions::CopyFrom(pMVar7,*(MessageOptions **)(this + 0x20));
    return;
  }
  return;
}

Assistant:

void Descriptor::CopyTo(DescriptorProto* proto) const {
  proto->set_name(name());

  for (int i = 0; i < field_count(); i++) {
    field(i)->CopyTo(proto->add_field());
  }
  for (int i = 0; i < oneof_decl_count(); i++) {
    oneof_decl(i)->CopyTo(proto->add_oneof_decl());
  }
  for (int i = 0; i < nested_type_count(); i++) {
    nested_type(i)->CopyTo(proto->add_nested_type());
  }
  for (int i = 0; i < enum_type_count(); i++) {
    enum_type(i)->CopyTo(proto->add_enum_type());
  }
  for (int i = 0; i < extension_range_count(); i++) {
    extension_range(i)->CopyTo(proto->add_extension_range());
  }
  for (int i = 0; i < extension_count(); i++) {
    extension(i)->CopyTo(proto->add_extension());
  }
  for (int i = 0; i < reserved_range_count(); i++) {
    DescriptorProto::ReservedRange* range = proto->add_reserved_range();
    range->set_start(reserved_range(i)->start);
    range->set_end(reserved_range(i)->end);
  }
  for (int i = 0; i < reserved_name_count(); i++) {
    proto->add_reserved_name(reserved_name(i));
  }

  if (&options() != &MessageOptions::default_instance()) {
    proto->mutable_options()->CopyFrom(options());
  }
}